

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"X: ",3);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<short,_(unsigned_char)__x03_> *)((long)this + 8));
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Y: ",6);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<short,_(unsigned_char)__x03_> *)((long)this + 0x18));
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Z: ",6);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<short,_(unsigned_char)__x03_> *)((long)this + 0x28));
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Vector<Type>::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_X.GetAsFloat32()
       << ",  Y: " << m_Y.GetAsFloat32()
       << ",  Z: " << m_Z.GetAsFloat32()
       << "\n";

    return ss.str();
}